

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<1>::operator()
          (bin_writer<1> *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar1;
  undefined8 *in_RSI;
  bool in_stack_0000000f;
  int in_stack_00000010;
  uint in_stack_00000014;
  
  bVar1 = internal::
          format_uint<1u,char,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,unsigned_int>
                    ((back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)it,
                     in_stack_00000014,in_stack_00000010,in_stack_0000000f);
  *in_RSI = bVar1.container;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }